

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowAbove
               (ImGuiWindow_conflict *potential_above,ImGuiWindow_conflict *potential_below)

{
  ImGuiWindow_conflict *pIVar1;
  byte in_AL;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)(GImGui->Windows).Size;
  do {
    if ((int)uVar2 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[uVar2 - 1];
    in_AL = in_AL & pIVar1 != potential_below | pIVar1 == potential_above;
  } while ((pIVar1 != potential_below) && (uVar2 = uVar2 - 1, pIVar1 != potential_above));
  return (bool)in_AL;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}